

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall skiwi::anon_unknown_23::foreign_call_11::~foreign_call_11(foreign_call_11 *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      external_function ef;
      ef.name = "print-scheme-variable";
      ef.address = (uint64_t)&print_scheme_variable;
      ef.return_type = external_function::T_VOID;
      ef.arguments.push_back(external_function::T_SCM);
      externals[ef.name] = ef;
      run("(define a (vector 1 0 0 0 0 1 0 0 0 0 1 0 20 30 40 1))");
      run("(foreign-call print-scheme-variable a)");
      std::cout << std::endl;
      }